

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

string * __thiscall
t_php_generator::classify(string *__return_storage_ptr__,t_php_generator *this,string *str)

{
  pointer pcVar1;
  byte *pbVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  byte *local_b8;
  long local_b0;
  byte local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  pointer local_90;
  byte *local_88;
  long local_80;
  byte local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  split(&local_48,this,str,'_');
  local_90 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar6 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + pbVar6->_M_string_length);
      pbVar2 = local_b8;
      if (local_b0 != 0) {
        iVar3 = toupper((uint)*local_b8);
        *pbVar2 = (byte)iVar3;
      }
      if (local_b8 == &local_a8) {
        uStack_70 = uStack_a0;
        local_88 = &local_78;
      }
      else {
        local_88 = local_b8;
      }
      _local_78 = CONCAT71(uStack_a7,local_a8);
      local_80 = local_b0;
      local_b0 = 0;
      local_a8 = 0;
      local_b8 = &local_a8;
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_88,0,(char *)0x0,
                                  (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_58 = *plVar5;
        lStack_50 = plVar4[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar5;
        local_68 = (long *)*plVar4;
      }
      local_60 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_90);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

string classify(string str) {
    string classe = "";

    vector<string> x = split(str, '_');

    for (const auto & i : x) {
      classe = classe + capitalize(i);
    }

    return classe;
  }